

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_node_main.c
# Opt level: O0

apx_error_t init_json_message_server(void)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *bind_address;
  uint8_t addressFamily;
  
  bind_address._3_1_ = '\0';
  __s = (char *)adt_str_cstr(m_bind_address);
  switch(m_bind_resource_type) {
  case '\x01':
    bind_address._3_1_ = '\x02';
    break;
  case '\x02':
    bind_address._3_1_ = '\n';
    break;
  case '\x03':
    bind_address._3_1_ = '\x01';
  case '\x04':
    sVar2 = strlen(__s);
    if ((sVar2 == 0) || (iVar1 = strcmp(__s,"localhost"), iVar1 == 0)) {
      bind_address._3_1_ = '\x02';
    }
  }
  if (bind_address._3_1_ == '\0') {
    bind_address._4_4_ = 0x22;
  }
  else {
    bind_address._4_4_ = json_server_init(m_apx_connection,bind_address._3_1_);
  }
  return bind_address._4_4_;
}

Assistant:

static apx_error_t init_json_message_server(void)
{
   uint8_t addressFamily = AF_UNSPEC;
   const char* bind_address = adt_str_cstr(m_bind_address);
   switch (m_bind_resource_type)
   {
   case APX_RESOURCE_TYPE_IPV4:
      addressFamily = AF_INET;
      break;
   case APX_RESOURCE_TYPE_IPV6:
      addressFamily = AF_INET6;
      break;
   case APX_RESOURCE_TYPE_FILE:
#ifdef _WIN32
      printf("UNIX domain sockets not supported in Windows\n");
      return APX_NOT_IMPLEMENTED_ERROR;
#else
      addressFamily = AF_UNIX;
#endif
   case APX_RESOURCE_TYPE_NAME:
      if ((strlen(bind_address) == 0) || (strcmp(bind_address, "localhost") == 0))
      {
         addressFamily = AF_INET;
      }
   }
   if (addressFamily != AF_UNSPEC)
   {
      return json_server_init(m_apx_connection, addressFamily);
   }
   return APX_CONNECTION_ERROR;
}